

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef,_3UL>::
         Construct(DB *db,LIST *params)

{
  IfcRectangleHollowProfileDef *in;
  
  in = (IfcRectangleHollowProfileDef *)operator_new(0xe0);
  *(undefined ***)&in->field_0xc8 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0xd0 = 0;
  *(char **)&in->field_0xd8 = "IfcRectangleHollowProfileDef";
  Assimp::IFC::Schema_2x3::IfcRectangleProfileDef::IfcRectangleProfileDef
            ((IfcRectangleProfileDef *)in,&PTR_construction_vtable_24__0087e480);
  *(undefined8 *)&(in->super_IfcRectangleProfileDef).field_0x98 = 0;
  (in->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRectangleHollowProfileDef_0087e3c8;
  *(undefined ***)&in->field_0xc8 = &PTR__IfcRectangleHollowProfileDef_0087e468;
  *(undefined ***)
   &(in->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x58 = &PTR__IfcRectangleHollowProfileDef_0087e3f0;
  *(undefined ***)&(in->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       &PTR__IfcRectangleHollowProfileDef_0087e418;
  *(undefined ***)&(in->super_IfcRectangleProfileDef).field_0x90 =
       &PTR__IfcRectangleHollowProfileDef_0087e440;
  (in->InnerFilletRadius).have = false;
  (in->OuterFilletRadius).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.
                 super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>
                 ._vptr_ObjectHelper +
         (long)(in->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.
               super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }